

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::MemPass::IsLiveVar(MemPass *this,uint32_t varId)

{
  bool bVar1;
  uint32_t uVar2;
  DefUseManager *pDVar3;
  Instruction *pIVar4;
  
  pDVar3 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar4 = analysis::DefUseManager::GetDef(pDVar3,varId);
  if (pIVar4->opcode_ == OpVariable) {
    uVar2 = Instruction::type_id(pIVar4);
    pDVar3 = Pass::get_def_use_mgr(&this->super_Pass);
    pIVar4 = analysis::DefUseManager::GetDef(pDVar3,uVar2);
    uVar2 = Instruction::GetSingleWordInOperand(pIVar4,0);
    if (uVar2 == 7) {
      bVar1 = HasLoads(this,varId);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool MemPass::IsLiveVar(uint32_t varId) const {
  const Instruction* varInst = get_def_use_mgr()->GetDef(varId);
  // assume live if not a variable eg. function parameter
  if (varInst->opcode() != spv::Op::OpVariable) return true;
  // non-function scope vars are live
  const uint32_t varTypeId = varInst->type_id();
  const Instruction* varTypeInst = get_def_use_mgr()->GetDef(varTypeId);
  if (spv::StorageClass(varTypeInst->GetSingleWordInOperand(
          kTypePointerStorageClassInIdx)) != spv::StorageClass::Function)
    return true;
  // test if variable is loaded from
  return HasLoads(varId);
}